

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

bool P_HitFriend(AActor *self)

{
  TObjPtr<AActor> *obj;
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  double distance;
  undefined1 local_58 [24];
  DAngle angle;
  FTranslatedLineTarget t;
  
  if (((self->flags).Value & 0x8000000) == 0) {
    return false;
  }
  obj = &self->target;
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar2 != (AActor *)0x0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    AActor::AngleTo((AActor *)&angle,self,SUB81(pAVar2,0));
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    distance = AActor::Distance2D(self,pAVar2,false);
    local_58._16_8_ = angle.Degrees;
    local_58._8_8_ = (PClass *)0x0;
    P_AimLineAttack((AActor *)local_58,(DAngle *)self,distance,
                    (FTranslatedLineTarget *)(local_58 + 0x10),(DAngle *)&t,(int)local_58 + 8,
                    (AActor *)0x1,(AActor *)0x0);
    pAVar2 = t.linetarget;
    if ((t.linetarget != (AActor *)0x0) &&
       (pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar2 != pAVar3)) {
      bVar1 = AActor::IsFriend(self,t.linetarget);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool P_HitFriend(AActor * self)
{
	FTranslatedLineTarget t;

	if (self->flags&MF_FRIENDLY && self->target != NULL)
	{
		DAngle angle = self->AngleTo(self->target);
		double dist = self->Distance2D(self->target);
		P_AimLineAttack (self, angle, dist, &t, 0., true);
		if (t.linetarget != NULL && t.linetarget != self->target)
		{
			return self->IsFriend (t.linetarget);
		}
	}
	return false;
}